

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O3

void __thiscall
spdlog::details::
elapsed_formatter<spdlog::details::null_scoped_padder,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
::format(elapsed_formatter<spdlog::details::null_scoped_padder,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
         *this,log_msg *msg,tm *param_2,memory_buf_t *dest)

{
  unsigned_long uVar1;
  unsigned_long value;
  long lVar2;
  format_int local_30;
  
  lVar2 = (msg->time).__d.__r;
  uVar1 = lVar2 - (this->last_message_time_).__d.__r;
  value = 0;
  if (0 < (long)uVar1) {
    value = uVar1;
  }
  (this->last_message_time_).__d.__r = lVar2;
  local_30.str_ = fmt::v7::format_int::format_unsigned<unsigned_long>(&local_30,value);
  lVar2 = (long)&local_30 - (long)local_30.str_;
  if (-0x16 < lVar2) {
    fmt::v7::detail::buffer<char>::append<char>
              (&dest->super_buffer<char>,local_30.str_,local_30.str_ + lVar2 + 0x15);
    return;
  }
  fmt::v7::detail::assert_fail
            ("/workspace/llm4binary/github/license_all_cmakelists_25/dkubek[P]NPRG041-image_match/extern/spdlog/spdlog/fmt/bundled/core.h"
             ,0x146,"negative value");
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override
    {
        auto delta = (std::max)(msg.time - last_message_time_, log_clock::duration::zero());
        auto delta_units = std::chrono::duration_cast<DurationUnits>(delta);
        last_message_time_ = msg.time;
        auto delta_count = static_cast<size_t>(delta_units.count());
        auto n_digits = static_cast<size_t>(ScopedPadder::count_digits(delta_count));
        ScopedPadder p(n_digits, padinfo_, dest);
        fmt_helper::append_int(delta_count, dest);
    }